

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t is_nfs4_perms(char *start,char *end,wchar_t *permset)

{
  char *pcVar1;
  char *local_30;
  char *p;
  wchar_t *permset_local;
  char *end_local;
  char *start_local;
  
  local_30 = start;
  while (local_30 < end) {
    pcVar1 = local_30 + 1;
    switch(*local_30) {
    case '-':
      local_30 = pcVar1;
      break;
    default:
      return L'\0';
    case 'A':
      *permset = *permset | 0x400;
      local_30 = pcVar1;
      break;
    case 'C':
      *permset = *permset | 0x2000;
      local_30 = pcVar1;
      break;
    case 'D':
      *permset = *permset | 0x100;
      local_30 = pcVar1;
      break;
    case 'R':
      *permset = *permset | 0x40;
      local_30 = pcVar1;
      break;
    case 'W':
      *permset = *permset | 0x80;
      local_30 = pcVar1;
      break;
    case 'a':
      *permset = *permset | 0x200;
      local_30 = pcVar1;
      break;
    case 'c':
      *permset = *permset | 0x1000;
      local_30 = pcVar1;
      break;
    case 'd':
      *permset = *permset | 0x800;
      local_30 = pcVar1;
      break;
    case 'o':
      *permset = *permset | 0x4000;
      local_30 = pcVar1;
      break;
    case 'p':
      *permset = *permset | 0x20;
      local_30 = pcVar1;
      break;
    case 'r':
      *permset = *permset | 8;
      local_30 = pcVar1;
      break;
    case 's':
      *permset = *permset | 0x8000;
      local_30 = pcVar1;
      break;
    case 'w':
      *permset = *permset | 0x10;
      local_30 = pcVar1;
      break;
    case 'x':
      *permset = *permset | 1;
      local_30 = pcVar1;
    }
  }
  return L'\x01';
}

Assistant:

static int
is_nfs4_perms(const char *start, const char *end, int *permset)
{
	const char *p = start;

	while (p < end) {
		switch (*p++) {
		case 'r':
			*permset |= ARCHIVE_ENTRY_ACL_READ_DATA;
			break;
		case 'w':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE_DATA;
			break;
		case 'x':
			*permset |= ARCHIVE_ENTRY_ACL_EXECUTE;
			break;
		case 'p':
			*permset |= ARCHIVE_ENTRY_ACL_APPEND_DATA;
			break;
		case 'D':
			*permset |= ARCHIVE_ENTRY_ACL_DELETE_CHILD;
			break;
		case 'd':
			*permset |= ARCHIVE_ENTRY_ACL_DELETE;
			break;
		case 'a':
			*permset |= ARCHIVE_ENTRY_ACL_READ_ATTRIBUTES;
			break;
		case 'A':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE_ATTRIBUTES;
			break;
		case 'R':
			*permset |= ARCHIVE_ENTRY_ACL_READ_NAMED_ATTRS;
			break;
		case 'W':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE_NAMED_ATTRS;
			break;
		case 'c':
			*permset |= ARCHIVE_ENTRY_ACL_READ_ACL;
			break;
		case 'C':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE_ACL;
			break;
		case 'o':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE_OWNER;
			break;
		case 's':
			*permset |= ARCHIVE_ENTRY_ACL_SYNCHRONIZE;
			break;
		case '-':
			break;
		default:
			return(0);
		}
	}
	return (1);
}